

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int simpleNext(sqlite3_tokenizer_cursor *pCursor,char **ppToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  uint uVar1;
  char cVar2;
  sqlite3_tokenizer *psVar3;
  sqlite3_tokenizer *psVar4;
  int iVar5;
  sqlite3_tokenizer *psVar6;
  long lVar7;
  byte bVar8;
  char *pcVar9;
  char cVar10;
  int iVar11;
  int n;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  
  iVar14 = *(int *)((long)&pCursor[2].pTokenizer + 4);
  iVar5 = *(int *)&pCursor[2].pTokenizer;
  if (iVar14 < iVar5) {
    psVar3 = pCursor->pTokenizer;
    psVar4 = pCursor[1].pTokenizer;
    do {
      lVar7 = (long)iVar14;
      bVar8 = *(byte *)((long)&psVar4->pModule + lVar7);
      if (-1 < (char)bVar8) {
        iVar11 = iVar14;
        do {
          iVar14 = iVar11;
          if (*(char *)((long)&psVar3[1].pModule + (ulong)bVar8) == '\0') break;
          iVar14 = iVar11 + 1;
          *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar14;
          if (iVar5 + -1 == iVar11) goto LAB_001cc183;
          bVar8 = *(byte *)((long)&psVar4->pModule + lVar7 + 1);
          lVar7 = lVar7 + 1;
          iVar11 = iVar14;
        } while (-1 < (char)bVar8);
      }
      iVar11 = iVar14;
      if (iVar14 < iVar5) {
        pcVar9 = (char *)((long)&psVar4->pModule + (long)iVar14);
        do {
          if ((-1 < (long)*pcVar9) &&
             (iVar11 = iVar14, *(char *)((long)&psVar3[1].pModule + (long)*pcVar9) != '\0')) break;
          iVar14 = iVar14 + 1;
          *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar14;
          pcVar9 = pcVar9 + 1;
          iVar11 = iVar5;
        } while (iVar5 != iVar14);
      }
      iVar14 = (int)lVar7;
      uVar12 = iVar11 - iVar14;
      if (uVar12 != 0 && iVar14 <= iVar11) {
        if (*(int *)&pCursor[5].pTokenizer < (int)uVar12) {
          uVar1 = uVar12 + 0x14;
          *(uint *)&pCursor[5].pTokenizer = uVar1;
          psVar6 = pCursor[4].pTokenizer;
          iVar5 = sqlite3_initialize();
          if (iVar5 != 0) {
            return 7;
          }
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          psVar6 = (sqlite3_tokenizer *)sqlite3Realloc(psVar6,(ulong)uVar1);
          if (psVar6 == (sqlite3_tokenizer *)0x0) {
            return 7;
          }
          pCursor[4].pTokenizer = psVar6;
        }
        if (0 < (int)uVar12) {
          uVar13 = 0;
          do {
            cVar2 = *(char *)((long)&psVar4->pModule + uVar13 + (long)iVar14);
            cVar10 = cVar2 + ' ';
            if (0x19 < (byte)(cVar2 + 0xbfU)) {
              cVar10 = cVar2;
            }
            *(char *)((long)&(pCursor[4].pTokenizer)->pModule + uVar13) = cVar10;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        *ppToken = (char *)pCursor[4].pTokenizer;
        *pnBytes = uVar12;
        *piStartOffset = iVar14;
        *piEndOffset = *(int *)((long)&pCursor[2].pTokenizer + 4);
        iVar5 = *(int *)&pCursor[3].pTokenizer;
        *(int *)&pCursor[3].pTokenizer = iVar5 + 1;
        *piPosition = iVar5;
        if (iVar14 < iVar11) {
          return 0;
        }
      }
LAB_001cc183:
      iVar5 = *(int *)&pCursor[2].pTokenizer;
      iVar14 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    } while (iVar14 < iVar5);
  }
  return 0x65;
}

Assistant:

static int simpleNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by simpleOpen */
  const char **ppToken,               /* OUT: *ppToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  simple_tokenizer_cursor *c = (simple_tokenizer_cursor *) pCursor;
  simple_tokenizer *t = (simple_tokenizer *) pCursor->pTokenizer;
  unsigned char *p = (unsigned char *)c->pInput;

  while( c->iOffset<c->nBytes ){
    int iStartOffset;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nBytes && simpleDelim(t, p[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nBytes && !simpleDelim(t, p[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int i, n = c->iOffset-iStartOffset;
      if( n>c->nTokenAllocated ){
        char *pNew;
        c->nTokenAllocated = n+20;
        pNew = sqlite3_realloc(c->pToken, c->nTokenAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->pToken = pNew;
      }
      for(i=0; i<n; i++){
        /* TODO(shess) This needs expansion to handle UTF-8
        ** case-insensitivity.
        */
        unsigned char ch = p[iStartOffset+i];
        c->pToken[i] = (char)((ch>='A' && ch<='Z') ? ch-'A'+'a' : ch);
      }
      *ppToken = c->pToken;
      *pnBytes = n;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;

      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}